

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::BasicReporter::startSpansLazily(BasicReporter *this)

{
  IConfig *pIVar1;
  ostream *poVar2;
  pointer pSVar3;
  SpanInfo *prevSpan;
  pointer pSVar4;
  Ptr<Catch::IConfig> local_50;
  string local_48 [8];
  long local_40;
  
  if ((this->m_testingSpan).emitted == false) {
    pIVar1 = (this->m_config).m_fullConfig.m_p;
    local_50.m_p = pIVar1;
    if (pIVar1 != (IConfig *)0x0) {
      (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
    }
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_48,pIVar1);
    std::__cxx11::string::~string(local_48);
    Ptr<Catch::IConfig>::~Ptr(&local_50);
    poVar2 = (this->m_config).m_stream;
    if (local_40 == 0) {
      poVar2 = std::operator<<(poVar2,"[Started testing]");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      poVar2 = std::operator<<(poVar2,"[Started testing: ");
      pIVar1 = (this->m_config).m_fullConfig.m_p;
      local_50.m_p = pIVar1;
      if (pIVar1 != (IConfig *)0x0) {
        (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
      }
      (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_48,pIVar1);
      poVar2 = std::operator<<(poVar2,local_48);
      poVar2 = std::operator<<(poVar2,"]");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_48);
      Ptr<Catch::IConfig>::~Ptr(&local_50);
    }
    (this->m_testingSpan).emitted = true;
  }
  if (((this->m_groupSpan).emitted == false) && ((this->m_groupSpan).name._M_string_length != 0)) {
    poVar2 = std::operator<<((this->m_config).m_stream,"[Started group: \'");
    poVar2 = std::operator<<(poVar2,(string *)&this->m_groupSpan);
    poVar2 = std::operator<<(poVar2,"\']");
    std::endl<char,std::char_traits<char>>(poVar2);
    (this->m_groupSpan).emitted = true;
  }
  if ((this->m_testSpan).emitted == false) {
    poVar2 = std::endl<char,std::char_traits<char>>((this->m_config).m_stream);
    poVar2 = std::operator<<(poVar2,"[Running: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->m_testSpan);
    poVar2 = std::operator<<(poVar2,"]");
    std::endl<char,std::char_traits<char>>(poVar2);
    (this->m_testSpan).emitted = true;
  }
  pSVar4 = (this->m_sectionSpans).
           super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (this->m_sectionSpans).
           super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((pSVar4 != pSVar3) && (pSVar3[-1].emitted == false)) &&
     (pSVar3[-1].name._M_string_length != 0)) {
    if (this->m_firstSectionInTestCase == true) {
      std::operator<<((this->m_config).m_stream,"\n");
      this->m_firstSectionInTestCase = false;
      pSVar4 = (this->m_sectionSpans).
               super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = (this->m_sectionSpans).
               super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; pSVar4 != pSVar3; pSVar4 = pSVar4 + 1) {
      if ((pSVar4->emitted == false) && ((pSVar4->name)._M_string_length != 0)) {
        poVar2 = std::operator<<((this->m_config).m_stream,"[Started section: \'");
        poVar2 = std::operator<<(poVar2,(string *)pSVar4);
        poVar2 = std::operator<<(poVar2,"\']");
        std::endl<char,std::char_traits<char>>(poVar2);
        pSVar4->emitted = true;
      }
    }
  }
  return;
}

Assistant:

void startSpansLazily() {
            if( !m_testingSpan.emitted ) {
                if( m_config.fullConfig()->name().empty() )
                    m_config.stream() << "[Started testing]" << std::endl;
                else
                    m_config.stream() << "[Started testing: " << m_config.fullConfig()->name() << "]" << std::endl;
                m_testingSpan.emitted = true;
            }

            if( !m_groupSpan.emitted && !m_groupSpan.name.empty() ) {
                m_config.stream() << "[Started group: '" << m_groupSpan.name << "']" << std::endl;
                m_groupSpan.emitted = true;
            }

            if( !m_testSpan.emitted ) {
                m_config.stream() << std::endl << "[Running: " << m_testSpan.name << "]" << std::endl;
                m_testSpan.emitted = true;
            }

            if( !m_sectionSpans.empty() ) {
                SpanInfo& sectionSpan = m_sectionSpans.back();
                if( !sectionSpan.emitted && !sectionSpan.name.empty() ) {
                    if( m_firstSectionInTestCase ) {
                        m_config.stream() << "\n";
                        m_firstSectionInTestCase = false;
                    }
                    std::vector<SpanInfo>::iterator it = m_sectionSpans.begin();
                    std::vector<SpanInfo>::iterator itEnd = m_sectionSpans.end();
                    for(; it != itEnd; ++it ) {
                        SpanInfo& prevSpan = *it;
                        if( !prevSpan.emitted && !prevSpan.name.empty() ) {
                            m_config.stream() << "[Started section: '" << prevSpan.name << "']" << std::endl;
                            prevSpan.emitted = true;
                        }
                    }
                }
            }
        }